

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

uint16_t netaddr_socket_get_port(netaddr_socket *sock)

{
  netaddr_socket *sock_local;
  
  if ((sock->v4).sin_family == 2) {
    sock_local._6_2_ = ntohs((sock->v4).sin_port);
  }
  else if ((sock->v4).sin_family == 10) {
    sock_local._6_2_ = ntohs((sock->v4).sin_port);
  }
  else {
    sock_local._6_2_ = 0;
  }
  return sock_local._6_2_;
}

Assistant:

uint16_t
netaddr_socket_get_port(const union netaddr_socket *sock) {
  switch (sock->std.sa_family) {
    case AF_INET:
      return ntohs(sock->v4.sin_port);
    case AF_INET6:
      return ntohs(sock->v6.sin6_port);
    default:
      return 0;
  }
}